

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall
leveldb::Version::ForEachOverlapping
          (Version *this,Slice user_key,Slice internal_key,void *arg,
          _func_bool_void_ptr_int_FileMetaData_ptr *func)

{
  FileMetaData **ppFVar1;
  Comparator *pCVar2;
  FileMetaData *pFVar3;
  FileMetaData **ppFVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  pointer ppFVar8;
  ulong uVar9;
  FileMetaData **ppFVar10;
  FileMetaData **ppFVar11;
  long lVar12;
  FileMetaData **ppFVar13;
  ulong uVar14;
  long lVar15;
  size_t __n;
  __normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  __i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  value_type __val_2;
  pointer ppFVar16;
  value_type __val;
  FileMetaData *f;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_b8;
  Version *local_98;
  FileMetaData *local_90;
  Slice local_88;
  FileMetaData **local_78;
  void *local_70;
  Comparator *local_68;
  char *local_60;
  size_t local_58;
  Slice local_50;
  Slice local_40;
  
  local_40.size_ = internal_key.size_;
  local_40.data_ = internal_key.data_;
  local_58 = user_key.size_;
  local_60 = user_key.data_;
  pCVar2 = (this->vset_->icmp_).user_comparator_;
  local_b8.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (FileMetaData **)0x0;
  local_b8.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (FileMetaData **)0x0;
  local_b8.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (FileMetaData **)0x0;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
            (&local_b8,
             (long)this->files_[0].
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)this->files_[0].
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppFVar8 = this->files_[0].
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_98 = this;
  if (this->files_[0].
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar8) {
    uVar9 = 0;
    uVar14 = 1;
    do {
      local_90 = ppFVar8[uVar9];
      local_88 = InternalKey::user_key(&local_90->smallest);
      iVar6 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_60,&local_88);
      if (-1 < iVar6) {
        local_50 = InternalKey::user_key(&local_90->largest);
        iVar6 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_60,&local_50);
        if (iVar6 < 1) {
          if (local_b8.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
            _M_realloc_insert<leveldb::FileMetaData*const&>
                      ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                       &local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_90);
          }
          else {
            *local_b8.
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_90;
            local_b8.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      ppFVar8 = local_98->files_[0].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar14 < (ulong)((long)local_98->files_[0].
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8 >> 3
                              );
      uVar9 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar5);
  }
  ppFVar16 = local_b8.
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppFVar8 = local_b8.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_68 = pCVar2;
  if (local_b8.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar12 = (long)local_b8.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = lVar12 >> 3;
    lVar15 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>>
              ((__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                )local_b8.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                )local_b8.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
               (ulong)(((uint)lVar15 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(leveldb::FileMetaData_*,_leveldb::FileMetaData_*)>)0x11c525
              );
    ppFVar11 = ppFVar8 + 1;
    ppFVar13 = ppFVar8;
    if (lVar12 < 0x81) {
      while (ppFVar1 = ppFVar11, ppFVar1 != ppFVar16) {
        pFVar3 = *ppFVar1;
        uVar9 = pFVar3->number;
        if ((*ppFVar8)->number < uVar9) {
          memmove((void *)((long)ppFVar13 + (0x10 - ((long)ppFVar1 - (long)ppFVar8))),ppFVar8,
                  (long)ppFVar1 - (long)ppFVar8);
          ppFVar11 = ppFVar8;
        }
        else {
          uVar14 = (*ppFVar13)->number;
          ppFVar11 = ppFVar1;
          while (uVar14 < uVar9) {
            *ppFVar11 = ppFVar11[-1];
            uVar14 = ppFVar11[-2]->number;
            ppFVar11 = ppFVar11 + -1;
          }
        }
        *ppFVar11 = pFVar3;
        ppFVar13 = ppFVar1;
        ppFVar11 = ppFVar1 + 1;
      }
    }
    else {
      local_78 = ppFVar16;
      __n = 8;
      ppFVar13 = ppFVar11;
      ppFVar16 = ppFVar8;
      local_70 = arg;
      do {
        ppFVar1 = (FileMetaData **)((long)ppFVar8 + __n);
        pFVar3 = *(FileMetaData **)((long)ppFVar8 + __n);
        uVar9 = pFVar3->number;
        if ((*ppFVar8)->number < uVar9) {
          memmove(ppFVar11,ppFVar8,__n);
          ppFVar10 = ppFVar8;
        }
        else {
          uVar14 = (*ppFVar16)->number;
          ppFVar10 = ppFVar1;
          ppFVar4 = ppFVar13;
          while (uVar14 < uVar9) {
            ppFVar10 = ppFVar4 + -1;
            *ppFVar4 = ppFVar4[-1];
            uVar14 = ppFVar4[-2]->number;
            ppFVar4 = ppFVar10;
          }
        }
        *ppFVar10 = pFVar3;
        __n = __n + 8;
        ppFVar13 = ppFVar13 + 1;
        ppFVar16 = ppFVar1;
      } while (__n != 0x80);
      for (ppFVar11 = ppFVar8 + 0x10; arg = local_70, ppFVar11 != local_78; ppFVar11 = ppFVar11 + 1)
      {
        pFVar3 = *ppFVar11;
        uVar9 = pFVar3->number;
        uVar14 = ppFVar11[-1]->number;
        ppFVar13 = ppFVar11;
        while (uVar14 < uVar9) {
          *ppFVar13 = ppFVar13[-1];
          uVar14 = ppFVar13[-2]->number;
          ppFVar13 = ppFVar13 + -1;
        }
        *ppFVar13 = pFVar3;
      }
    }
    if (local_b8.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_b8.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar9 = 0;
      uVar14 = 1;
      do {
        bVar5 = (*func)(arg,0,local_b8.
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar9]);
        if (!bVar5) goto LAB_0011c505;
        bVar5 = uVar14 < (ulong)((long)local_b8.
                                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar9 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar5);
    }
  }
  files = local_98->files_;
  lVar15 = -6;
  do {
    files = files + 1;
    lVar12 = (long)(files->
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(files->
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
    if (lVar12 == 0) {
      iVar6 = 10;
    }
    else {
      uVar7 = FindFile(&local_98->vset_->icmp_,files,&local_40);
      iVar6 = 0;
      if ((ulong)uVar7 < (ulong)(lVar12 >> 3)) {
        pFVar3 = (files->
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar7];
        local_88 = InternalKey::user_key(&pFVar3->smallest);
        iVar6 = (*local_68->_vptr_Comparator[2])(local_68,&local_60,&local_88);
        if (-1 < iVar6) {
          bVar5 = (*func)(arg,(int)lVar15 + 7,pFVar3);
          iVar6 = 1;
          if (!bVar5) goto LAB_0011c4ef;
        }
        iVar6 = 0;
      }
    }
LAB_0011c4ef:
    if (((iVar6 != 10) && (iVar6 != 0)) || (lVar15 = lVar15 + 1, lVar15 == 0)) {
LAB_0011c505:
      if (local_b8.
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (FileMetaData **)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void Version::ForEachOverlapping(Slice user_key, Slice internal_key, void* arg,
                                 bool (*func)(void*, int, FileMetaData*)) {
  const Comparator* ucmp = vset_->icmp_.user_comparator();

  // Search level-0 in order from newest to oldest.
  std::vector<FileMetaData*> tmp;
  tmp.reserve(files_[0].size());
  for (uint32_t i = 0; i < files_[0].size(); i++) {
    FileMetaData* f = files_[0][i];
    if (ucmp->Compare(user_key, f->smallest.user_key()) >= 0 &&
        ucmp->Compare(user_key, f->largest.user_key()) <= 0) {
      tmp.push_back(f);
    }
  }
  if (!tmp.empty()) {
    std::sort(tmp.begin(), tmp.end(), NewestFirst);
    for (uint32_t i = 0; i < tmp.size(); i++) {
      if (!(*func)(arg, 0, tmp[i])) {
        return;
      }
    }
  }

  // Search other levels.
  for (int level = 1; level < config::kNumLevels; level++) {
    size_t num_files = files_[level].size();
    if (num_files == 0) continue;

    // Binary search to find earliest index whose largest key >= internal_key.
    uint32_t index = FindFile(vset_->icmp_, files_[level], internal_key);
    if (index < num_files) {
      FileMetaData* f = files_[level][index];
      if (ucmp->Compare(user_key, f->smallest.user_key()) < 0) {
        // All of "f" is past any data for user_key
      } else {
        if (!(*func)(arg, level, f)) {
          return;
        }
      }
    }
  }
}